

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declared_rooms.h
# Opt level: O0

void __thiscall HouseOfBlues::HouseOfBlues(HouseOfBlues *this)

{
  mapped_type *pmVar1;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  HouseOfBlues *local_10;
  HouseOfBlues *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "This is a place where men shed tears and pour out emotion! Of course, after 2 or 3 pints of the finest ale. The miscreants who frequent cavernous house know the warmth of beds not their own. Doors sing with laughter and a timely cry or two. Will you enter to find love?"
             ,&local_31);
  Room::Room(&this->super_Room,5,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_Room)._vptr_Room = (_func_int **)&PTR_describe_abi_cxx11__0014ad20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"west",&local_69);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&(this->super_Room).exits,(key_type *)local_68);
  *pmVar1 = 4;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

HouseOfBlues() : Room(Map::Location::HOUSE_OF_BLUES, "This is a place where men shed tears and pour out emotion! Of course, after 2 or 3 pints of the finest ale. The miscreants who frequent cavernous house know the warmth of beds not their own. Doors sing with laughter and a timely cry or two. Will you enter to find love?")
  {
    exits["west"] = Map::Location::GATES_OF_SHOGUN;
  }